

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,4u>::copyTo<ImageT<unsigned_int,1u>>
          (ImageT<unsigned_int,_4U> *this,ImageT<unsigned_int,_1U> *dst,string_view swizzle)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  Image *in_RSI;
  ImageT<unsigned_int,_4U> *in_RDI;
  bool bVar7;
  uint32_t c;
  size_t i;
  char in_stack_ffffffffffffff7f;
  color<unsigned_int,_1U> *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint local_2c;
  ulong local_28;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  iVar2 = (*(in_RDI->super_Image)._vptr_Image[6])();
  iVar3 = (*in_RSI->_vptr_Image[6])();
  if (iVar2 != iVar3) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 1>]"
                 );
  }
  uVar5 = (in_RDI->super_Image).width;
  uVar4 = Image::getWidth(in_RSI);
  bVar7 = false;
  if (uVar5 == uVar4) {
    uVar5 = (in_RDI->super_Image).height;
    uVar4 = Image::getHeight(in_RSI);
    bVar7 = uVar5 == uVar4;
  }
  if (bVar7) {
    Image::setTransferFunction(in_RSI,(in_RDI->super_Image).transferFunction);
    Image::setPrimaries(in_RSI,(in_RDI->super_Image).primaries);
    for (local_28 = 0; uVar5 = Image::getPixelCount(&in_RDI->super_Image), local_28 < uVar5;
        local_28 = local_28 + 1) {
      for (local_2c = 0;
          (uVar6 = (*in_RSI->_vptr_Image[5])(), local_2c < uVar6 &&
          (uVar6 = (*(in_RDI->super_Image)._vptr_Image[5])(), local_2c < uVar6));
          local_2c = local_2c + 1) {
        pp_Var1 = in_RSI[1]._vptr_Image;
        std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_10,(ulong)local_2c)
        ;
        uVar6 = ImageT<unsigned_int,_4U>::swizzlePixel
                          ((ImageT<unsigned_int,_4U> *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (Color *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        color<unsigned_int,_1U>::set
                  ((color<unsigned_int,_1U> *)((long)pp_Var1 + local_28 * 4),local_2c,uVar6);
      }
      while (in_stack_ffffffffffffff8c = local_2c, uVar6 = (*in_RSI->_vptr_Image[5])(),
            in_stack_ffffffffffffff8c < uVar6) {
        if (local_2c < 3) {
          color<unsigned_int,_1U>::set
                    ((color<unsigned_int,_1U> *)((long)in_RSI[1]._vptr_Image + local_28 * 4),
                     local_2c,0);
        }
        else {
          in_stack_ffffffffffffff80 =
               (color<unsigned_int,_1U> *)((long)in_RSI[1]._vptr_Image + local_28 * 4);
          in_stack_ffffffffffffff88 = local_2c;
          uVar6 = color_base<unsigned_int,_4U>::one();
          color<unsigned_int,_1U>::set(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,uVar6);
        }
        local_2c = local_2c + 1;
      }
    }
    return in_RDI;
  }
  __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x50b,
                "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 1>]"
               );
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }